

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

Int128 __thiscall ClipperLib::Int128::operator/(Int128 *this,Int128 *rhs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong *in_RDX;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  Int128 IVar14;
  
  uVar1 = *in_RDX;
  uVar6 = in_RDX[1];
  if (uVar6 != 0 || uVar1 != 0) {
    uVar2 = rhs->hi;
    uVar3 = rhs->lo;
    uVar5 = uVar2;
    if ((long)uVar2 < 0) {
      if (uVar3 == 0) {
        uVar3 = 0;
        uVar5 = -uVar2;
      }
      else {
        uVar3 = -uVar3;
        uVar5 = ~uVar2;
      }
    }
    uVar10 = uVar1;
    if ((long)uVar1 < 0) {
      if (uVar6 == 0) {
        uVar6 = 0;
        uVar10 = -uVar1;
      }
      else {
        uVar6 = -uVar6;
        uVar10 = ~uVar1;
      }
    }
    bVar13 = uVar5 < uVar10;
    if (uVar10 == uVar5) {
      bVar13 = (long)uVar3 < (long)uVar6;
    }
    if (bVar13) {
      this->hi = 0;
      this->lo = 0;
    }
    else {
      uVar8 = ~uVar10;
      if (uVar6 == 0) {
        uVar8 = -uVar10;
      }
      iVar9 = 0x80;
      uVar10 = 0;
      uVar7 = 0;
      while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
        uVar7 = uVar7 << 1 | uVar10 >> 0x3f;
        uVar10 = uVar10 << 1 | uVar5 >> 0x3f;
        uVar5 = uVar5 << 1 | uVar3 >> 0x3f;
        uVar11 = uVar10 - uVar6;
        uVar12 = uVar7 + uVar8 + (ulong)(uVar11 < -uVar6);
        if (-1 < (long)uVar12) {
          uVar7 = uVar12;
          uVar10 = uVar11;
        }
        uVar3 = (ulong)(-1 < (long)uVar12) + uVar3 * 2;
      }
      if ((long)(uVar2 ^ uVar1) < 0) {
        if (uVar3 == 0) {
          uVar5 = -uVar5;
          uVar3 = 0;
        }
        else {
          uVar3 = -uVar3;
          uVar5 = ~uVar5;
        }
      }
      this->hi = uVar5;
      this->lo = uVar3;
    }
    IVar14.lo = uVar6;
    IVar14.hi = (long64)this;
    return IVar14;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Int128 operator/: divide by zero";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

Int128 operator/ (const Int128 &rhs) const
    {
      if (rhs.lo == 0 && rhs.hi == 0)
        throw "Int128 operator/: divide by zero";
      bool negate = (rhs.hi < 0) != (hi < 0);
      Int128 result(*this), denom(rhs);
      if (result.hi < 0) Negate(result);
      if (denom.hi < 0)  Negate(denom);
      if (denom > result) return Int128(0); //result is only a fraction of 1
      Negate(denom);

      Int128 p(0);
      for (int i = 0; i < 128; ++i)
      {
        p.hi = p.hi << 1;
        if (p.lo < 0) p.hi++;
        p.lo = long64(p.lo) << 1;
        if (result.hi < 0) p.lo++;
        result.hi = result.hi << 1;
        if (result.lo < 0) result.hi++;
        result.lo = long64(result.lo) << 1;
        Int128 p2(p);
        p += denom;
        if (p.hi < 0) p = p2;
        else result.lo++;
      }
      if (negate) Negate(result);
      return result;
    }